

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::optimizeWithConstantOnRight(OptimizeInstructions *this,Binary *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  Type type;
  Expression *pEVar4;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> pBVar5;
  undefined1 auVar6 [40];
  undefined1 auVar7 [40];
  undefined1 auVar8 [40];
  undefined1 auVar9 [40];
  undefined1 auVar10 [40];
  undefined1 auVar11 [40];
  undefined1 auVar12 [40];
  undefined1 auVar13 [40];
  undefined1 auVar14 [40];
  undefined1 auVar15 [40];
  undefined1 auVar16 [40];
  undefined1 auVar17 [40];
  undefined1 auVar18 [40];
  undefined1 auVar19 [40];
  undefined1 auVar20 [40];
  undefined1 auVar21 [40];
  undefined1 auVar22 [40];
  undefined1 auVar23 [40];
  undefined1 auVar24 [40];
  undefined1 auVar25 [40];
  undefined1 auVar26 [40];
  undefined1 auVar27 [40];
  undefined1 auVar28 [40];
  undefined1 auVar29 [40];
  undefined1 auVar30 [40];
  undefined1 auVar31 [40];
  undefined1 auVar32 [40];
  undefined1 auVar33 [40];
  undefined1 auVar34 [40];
  undefined1 auVar35 [40];
  undefined1 auVar36 [40];
  undefined1 auVar37 [40];
  undefined1 auVar38 [40];
  undefined1 auVar39 [40];
  undefined1 auVar40 [40];
  bool bVar41;
  bool bVar42;
  bool bVar43;
  BinaryOp BVar44;
  UnaryOp UVar45;
  BinaryOp BVar46;
  Index IVar47;
  int iVar48;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> casted;
  ulong uVar49;
  Binary *pBVar50;
  Unary *pUVar51;
  undefined4 extraout_var;
  PassOptions *options;
  Op OVar52;
  Module *wasm;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  BinaryOp *this_01;
  double dVar53;
  undefined1 auVar54 [16];
  anon_union_16_6_1532cd5a_for_Literal_0 local_768;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
  local_758;
  undefined8 local_720;
  undefined4 uStack_718;
  undefined4 uStack_714;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  *local_710;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_6e8;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *local_6c0;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  Binary **local_698;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined4 uStack_678;
  undefined4 uStack_674;
  Builder *local_670;
  undefined1 *puStack_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined1 *local_648;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined1 *local_620;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_618;
  undefined8 local_610;
  undefined8 local_608;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  Binary **local_5f8;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_5d0;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_5a8;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined4 uStack_588;
  undefined4 uStack_584;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_580;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_558;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined4 uStack_538;
  undefined4 uStack_534;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_530;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_508;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_4e0;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_4b8;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined4 uStack_498;
  undefined4 uStack_494;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_490;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_468;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined4 uStack_448;
  undefined4 uStack_444;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_440;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_438;
  undefined8 local_430;
  undefined8 local_428;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_418;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_3f0;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_3c8;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_3a0;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_378;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined4 uStack_358;
  undefined4 uStack_354;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_350;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_328;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 *local_300;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_2d8;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_2b0;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined1 *local_288;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined4 uStack_268;
  undefined4 uStack_264;
  Binary **local_260;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_238;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined4 uStack_218;
  undefined4 uStack_214;
  Binary **local_210;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  Builder *local_1e8;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 *local_1c0;
  undefined1 *puStack_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [8];
  Binary *inner;
  Const *c_1;
  undefined8 local_190;
  Type local_180;
  pointer pLStack_178;
  undefined1 local_158 [8];
  Binary *inner_1;
  undefined1 local_148 [8];
  Expression *x_1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_138;
  Type local_128;
  pointer pLStack_120;
  anon_union_16_6_1532cd5a_for_Literal_0 local_100;
  undefined1 local_f0 [16];
  matched_t<wasm::Match::Internal::ExactKind<long>_> *local_e0;
  anon_union_16_6_1532cd5a_for_Literal_0 *paStack_d8;
  Builder local_b8;
  Builder builder;
  Const *c;
  anon_union_16_6_1532cd5a_for_Literal_0 local_88;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
  local_78;
  Binary *local_40;
  HeapType local_38;
  Expression *left;
  
  local_b8.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  pBVar50 = (Binary *)curr->right;
  if ((pBVar50->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id != ConstId)
  {
LAB_009e7c0d:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
  }
  type.id = (pBVar50->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  local_78.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_88.i64 = 0;
  local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_78.submatchers.curr.data = 0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar46 = curr->op, BVar44 = Abstract::getBinary((Type)(curr->left->type).id,Shl),
        BVar46 == BVar44)) {
    local_38.id = (uintptr_t)curr->left;
    pEVar4 = curr->right;
    if (pEVar4->_id == ConstId) {
      if ((element_type *)local_88.i64 != (element_type *)0x0) {
        ((local_88.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        tag).super_IString.str._M_len = (size_t)pEVar4;
      }
      Literal::Literal((Literal *)&local_100.func,(Literal *)(pEVar4 + 1));
      bVar41 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches(&local_78,
                         (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                          *)&local_100.func);
      Literal::~Literal((Literal *)&local_100.func);
      if (bVar41) {
        return (Expression *)(Binary *)local_38.id;
      }
    }
  }
  local_f0._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_100.i64 = 0;
  local_e0 = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  paStack_d8 = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar46 = curr->op, BVar44 = Abstract::getBinary((Type)(curr->left->type).id,ShrU),
        BVar46 == BVar44)) {
    local_38.id = (uintptr_t)curr->left;
    pEVar4 = curr->right;
    if (pEVar4->_id == ConstId) {
      if ((element_type *)local_100.i64 != (element_type *)0x0) {
        ((local_100.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        tag).super_IString.str._M_len = (size_t)pEVar4;
      }
      Literal::Literal((Literal *)&builder,(Literal *)(pEVar4 + 1));
      bVar41 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                          *)local_f0,(Literal *)&builder);
      Literal::~Literal((Literal *)&builder);
      if (bVar41) {
        return (Expression *)(Binary *)local_38.id;
      }
    }
  }
  local_138.i64 = 0;
  local_148 = (undefined1  [8])0x0;
  local_128.id = 0;
  pLStack_120 = (pointer)0x0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar46 = curr->op, BVar44 = Abstract::getBinary((Type)(curr->left->type).id,ShrS),
        BVar46 == BVar44)) {
    local_38.id = (uintptr_t)curr->left;
    pBVar5 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
              )curr->right;
    if ((pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == ConstId
       ) {
      if (local_148 != (undefined1  [8])0x0) {
        (((Name *)local_148)->super_IString).str._M_len = (size_t)pBVar5;
      }
      Literal::Literal((Literal *)&builder,(Literal *)&pBVar5->op);
      bVar41 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                          *)&local_138.func,(Literal *)&builder);
      Literal::~Literal((Literal *)&builder);
      if (bVar41) {
        return (Expression *)(Binary *)local_38.id;
      }
    }
  }
  local_190 = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  inner = (Binary *)0x0;
  local_180.id = 0;
  pLStack_178 = (pointer)0x0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar46 = curr->op, BVar44 = Abstract::getBinary((Type)(curr->left->type).id,Or),
        BVar46 == BVar44)) {
    local_38.id = (uintptr_t)curr->left;
    pEVar4 = curr->right;
    if (pEVar4->_id == ConstId) {
      if (inner != (Binary *)0x0) {
        *(Expression **)
         &(inner->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression = pEVar4;
      }
      Literal::Literal((Literal *)&builder,(Literal *)(pEVar4 + 1));
      bVar41 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                          *)&stack0xfffffffffffffe70,(Literal *)&builder);
      Literal::~Literal((Literal *)&builder);
      if (bVar41) {
        return (Expression *)(Binary *)local_38.id;
      }
    }
  }
  local_758.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0
  ;
  local_768.i64 = 0;
  local_758.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_758.submatchers.curr.data = 0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (BVar46 = curr->op, BVar44 = Abstract::getBinary((Type)(curr->left->type).id,Xor),
        BVar46 == BVar44)) {
    local_38.id = (uintptr_t)curr->left;
    pEVar4 = curr->right;
    if (pEVar4->_id == ConstId) {
      if ((element_type *)local_768.i64 != (element_type *)0x0) {
        ((local_768.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        tag).super_IString.str._M_len = (size_t)pEVar4;
      }
      Literal::Literal((Literal *)&builder,(Literal *)(pEVar4 + 1));
      bVar41 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches(&local_758,(Literal *)&builder);
      Literal::~Literal((Literal *)&builder);
      if (bVar41) {
        return (Expression *)(Binary *)local_38.id;
      }
    }
  }
  local_f0._0_8_ = &inner;
  local_f0._8_8_ = &local_88;
  local_78.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_88.i64 = 0;
  local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_78.submatchers.curr.data = 0;
  local_100.i64 = 0;
  local_100._8_4_ = 5;
  inner = (Binary *)&stack0xffffffffffffffc8;
  c_1 = (Const *)this;
  local_40 = pBVar50;
  bVar41 = Match::Internal::
           Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
           ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                      *)&local_100.func,
                     (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                      )curr);
  if (bVar41) {
    return (Expression *)local_40;
  }
  local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_768;
  local_f0._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_100.i64 = 0;
  local_e0 = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  paStack_d8 = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
  local_148 = (undefined1  [8])0x0;
  x_1 = (Expression *)CONCAT44(x_1._4_4_,0xf);
  local_768.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffc8;
  local_768.func.super_IString.str._M_str = (char *)this;
  local_138.func.super_IString.str._M_str = (char *)&local_100;
  bVar41 = Match::Internal::
           Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
           ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                      *)local_148,
                     (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                      )curr);
  if (bVar41) {
    return (Expression *)local_40;
  }
  local_78.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_88.i64 = 0;
  local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_78.submatchers.curr.data = 0;
  local_148 = (undefined1  [8])local_1a8;
  x_1 = (Expression *)CONCAT44(x_1._4_4_,4);
  local_138.func.super_IString.str._M_str = (char *)&inner;
  local_f0._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_e0 = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_100.i64 = 0;
  local_720 = 0;
  uStack_718 = 5;
  auVar6._4_4_ = uStack_714;
  auVar6._0_4_ = 5;
  auVar6._8_8_ = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                  *)local_148;
  auVar6._16_8_ = &local_100;
  auVar6._24_8_ = local_700;
  auVar6._32_8_ = 0;
  local_710 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
               *)local_148;
  paStack_708 = &local_100;
  inner = (Binary *)&stack0xffffffffffffffc8;
  local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_88;
  bVar41 = Match::
           matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                     ((Expression *)curr,
                      (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                       )(auVar6 << 0x40));
  pBVar50 = local_40;
  if (bVar41) {
    if (((((this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner)->options).shrinkLevel == 0) &&
       (uVar49 = Literal::getInteger((Literal *)&local_40->op), uVar49 - 1 < (uVar49 ^ uVar49 - 1)))
    {
      curr->left = (Expression *)local_38.id;
      if ((*(Expression **)((long)local_1a8 + 0x18))->_id == ConstId) {
        pBVar50 = Builder::makeBinary(&local_b8,*(BinaryOp *)((long)local_1a8 + 0x10),
                                      *(Expression **)((long)local_1a8 + 0x18),(Expression *)curr);
        return (Expression *)pBVar50;
      }
      goto LAB_009e7c0d;
    }
    Literal::neg((Literal *)&local_88.func,(Literal *)&pBVar50->op);
    Literal::operator=((Literal *)&pBVar50->op,(Literal *)&local_88.func);
    goto LAB_009e6cc3;
  }
  local_78.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_88.i64 = 0;
  local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_78.submatchers.curr.data = 0;
  local_6f8 = 0;
  uStack_6f0 = 0x14;
  auVar7._4_4_ = uStack_6ec;
  auVar7._0_4_ = 0x14;
  auVar7._8_8_ = &local_100;
  auVar7._16_8_ = &local_88;
  auVar7._24_8_ = local_6d8;
  auVar7._32_8_ = 0;
  local_6e8 = &local_100;
  paStack_6e0 = &local_88;
  local_100.i64 = (int64_t)(element_type *)&stack0xffffffffffffffc8;
  bVar41 = Match::
           matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                     ((Expression *)curr,
                      (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                       )(auVar7 << 0x40));
  if (bVar41) {
LAB_009e6c7e:
    OVar52 = EqZ;
  }
  else {
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    local_100.i64 = 0;
    local_100._8_4_ = 9;
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    x_1 = (Expression *)this;
    local_f0._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)local_148;
    local_f0._8_8_ = &local_88;
    bVar41 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar41) {
      Literal::makeZero((Literal *)&local_88.func,type);
      pBVar50 = local_40;
      Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
      goto LAB_009e6d5e;
    }
    bVar41 = false;
    inner = (Binary *)0x0;
    local_f0._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0
    ;
    local_e0 = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&builder;
    local_148 = (undefined1  [8])local_158;
    x_1 = (Expression *)CONCAT44(x_1._4_4_,9);
    local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&inner;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    local_6d0 = 0;
    uStack_6c8 = 0x15;
    auVar8._4_4_ = uStack_6c4;
    auVar8._0_4_ = 0x15;
    auVar8._8_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                   local_148;
    auVar8._16_8_ = &local_88;
    auVar8._24_8_ = local_6b0;
    auVar8._32_8_ = 0;
    local_6c0 = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                local_148;
    paStack_6b8 = &local_88;
    local_138.func.super_IString.str._M_str = (char *)&local_100;
    bVar42 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar8 << 0x40));
    bVar43 = false;
    if (bVar42) {
      bVar41 = Literal::isSignedMin
                         ((Literal *)
                          &((builder.wasm)->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar41) {
        bVar43 = true;
        bVar41 = false;
      }
      else {
        Literal::abs((Literal *)&local_768.func,(int)builder.wasm + 0x10);
        uVar49 = Literal::getInteger((Literal *)&local_768.func);
        bVar41 = true;
        if (uVar49 == 0) {
          bVar43 = false;
        }
        else {
          bVar43 = (uVar49 & uVar49 - 1) == 0;
        }
      }
    }
    if (bVar41) {
      Literal::~Literal((Literal *)&local_768.func);
    }
    if (bVar43) {
      BVar46 = Abstract::getBinary((Type)((builder.wasm)->exports).
                                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,And);
      (((Literals *)((long)local_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0]
      .field_0.i32 = BVar46;
      bVar41 = Literal::isSignedMin
                         ((Literal *)
                          &((builder.wasm)->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar41) {
        Literal::makeSignedMax
                  ((Literal *)&local_88.func,
                   (Type)((builder.wasm)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
        Literal::operator=((Literal *)
                           &((builder.wasm)->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Literal *)&local_88.func);
        this_00 = &local_88;
      }
      else {
        Literal::abs((Literal *)&local_100.func,(int)builder.wasm + 0x10);
        Literal::makeOne((Literal *)local_148,
                         (Type)((builder.wasm)->exports).
                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
        Literal::sub((Literal *)&local_88.func,(Literal *)&local_100.func,(Literal *)local_148);
        Literal::operator=((Literal *)
                           &((builder.wasm)->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Literal *)&local_88.func);
        Literal::~Literal((Literal *)&local_88.func);
        Literal::~Literal((Literal *)local_148);
        this_00 = &local_100;
      }
      Literal::~Literal((Literal *)&this_00->func);
      if (bVar43) {
        return (Expression *)curr;
      }
    }
    local_f0._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0
    ;
    local_e0 = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    paStack_d8 = (anon_union_16_6_1532cd5a_for_Literal_0 *)CONCAT44(paStack_d8._4_4_,1);
    local_100.i64 = 0;
    local_6a8 = 0;
    uStack_6a0 = 0xf;
    local_698 = &inner;
    auVar9._4_4_ = uStack_69c;
    auVar9._0_4_ = 0xf;
    auVar9._8_8_ = local_698;
    auVar9._16_8_ = &local_100;
    auVar9._24_8_ = local_688;
    auVar9._32_8_ = 0;
    paStack_690 = &local_100;
    inner = (Binary *)&stack0xffffffffffffffc8;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                         )(auVar9 << 0x40));
    if (bVar41) {
LAB_009e7112:
      IVar47 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this);
      if (IVar47 == 1) {
        return (Expression *)(Binary *)local_38.id;
      }
    }
    else {
      local_138.i64 = 0;
      local_128.id = 0;
      pLStack_120 = (pointer)((ulong)pLStack_120 & 0xffffffff00000000);
      local_148 = (undefined1  [8])0x0;
      local_680 = 0;
      uStack_678 = 0x10;
      local_670 = &builder;
      puStack_668 = local_148;
      auVar10._4_4_ = uStack_674;
      auVar10._0_4_ = 0x10;
      auVar10._8_8_ = local_670;
      auVar10._16_8_ = puStack_668;
      auVar10._24_8_ = local_660;
      auVar10._32_8_ = 0;
      builder.wasm = (Module *)&stack0xffffffffffffffc8;
      bVar41 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                           )(auVar10 << 0x40));
      if (bVar41) goto LAB_009e7112;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      local_78.submatchers.curr.data = 1;
      local_88.i64 = 0;
      local_658 = 0;
      uStack_650 = 0xf;
      local_648 = local_158;
      auVar11._4_4_ = uStack_64c;
      auVar11._0_4_ = 0xf;
      auVar11._8_8_ = local_648;
      auVar11._16_8_ = &local_88;
      auVar11._24_8_ = local_638;
      auVar11._32_8_ = 0;
      paStack_640 = &local_88;
      local_158 = (undefined1  [8])&stack0xffffffffffffffc8;
      bVar41 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           )(auVar11 << 0x40));
      if (bVar41) goto LAB_009e7112;
    }
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    local_630 = 0;
    uStack_628 = 0x28;
    local_620 = local_148;
    auVar12._4_4_ = uStack_624;
    auVar12._0_4_ = 0x28;
    auVar12._8_8_ = local_620;
    auVar12._16_8_ = &local_88;
    auVar12._24_8_ = local_610;
    auVar12._32_8_ = 0;
    paStack_618 = &local_88;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar12 << 0x40));
    if (bVar41) {
LAB_009e723a:
      IVar47 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this);
      if (IVar47 == 1) {
        UVar45 = WrapInt64;
        curr = (Binary *)local_38.id;
        goto LAB_009e6c9c;
      }
    }
    else {
      inner = (Binary *)&stack0xffffffffffffffc8;
      local_f0._0_8_ =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_100.i64 = 0;
      local_e0 = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      paStack_d8 = (anon_union_16_6_1532cd5a_for_Literal_0 *)0x0;
      local_608 = 0;
      uStack_600 = 0x29;
      local_5f8 = &inner;
      auVar13._4_4_ = uStack_5fc;
      auVar13._0_4_ = 0x29;
      auVar13._8_8_ = local_5f8;
      auVar13._16_8_ = &local_100;
      auVar13._24_8_ = local_5e8;
      auVar13._32_8_ = 0;
      paStack_5f0 = &local_100;
      bVar41 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           )(auVar13 << 0x40));
      if (bVar41) goto LAB_009e723a;
    }
    pBVar50 = local_40;
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    local_5e0 = 0;
    uStack_5d8 = 0x15;
    auVar14._4_4_ = uStack_5d4;
    auVar14._0_4_ = 0x15;
    auVar14._8_8_ = &local_100;
    auVar14._16_8_ = &local_88;
    auVar14._24_8_ = local_5c0;
    auVar14._32_8_ = 0;
    local_5d0 = &local_100;
    paStack_5c8 = &local_88;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar14 << 0x40));
    if ((bVar41) &&
       (IVar47 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this),
       IVar47 == 1)) goto LAB_009e6c7e;
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    local_5b8 = 0;
    uStack_5b0 = 0x11;
    auVar15._4_4_ = uStack_5ac;
    auVar15._0_4_ = 0x11;
    auVar15._8_8_ = &local_100;
    auVar15._16_8_ = &local_88;
    auVar15._24_8_ = local_598;
    auVar15._32_8_ = 0;
    local_5a8 = &local_100;
    paStack_5a0 = &local_88;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar15 << 0x40));
    if ((bVar41) &&
       (IVar47 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this),
       IVar47 == 1)) {
      UVar45 = Abstract::getUnary(type,EqZ);
      curr = (Binary *)Builder::makeUnary(&local_b8,UVar45,(Expression *)local_38.id);
      if (((Type *)(local_38.id + 8))->id != 3) {
        return (Expression *)curr;
      }
      UVar45 = ExtendUInt32;
      goto LAB_009e6c9c;
    }
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    local_590 = 0;
    uStack_588 = 0x10;
    auVar16._4_4_ = uStack_584;
    auVar16._0_4_ = 0x10;
    auVar16._8_8_ = &local_100;
    auVar16._16_8_ = &local_88;
    auVar16._24_8_ = local_570;
    auVar16._32_8_ = 0;
    local_580 = &local_100;
    paStack_578 = &local_88;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar16 << 0x40));
    if ((bVar41) &&
       (IVar47 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_38.id,this),
       IVar47 == 1)) {
      wasm = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
      options = &((this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).super_Pass.runner)->options;
      goto LAB_009e7557;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    local_568 = 0;
    uStack_560 = 0xf;
    auVar17._4_4_ = uStack_55c;
    auVar17._0_4_ = 0xf;
    auVar17._8_8_ = &local_100;
    auVar17._16_8_ = &local_88;
    auVar17._24_8_ = local_548;
    auVar17._32_8_ = 0;
    local_558 = &local_100;
    paStack_550 = &local_88;
    local_100.i64 = (int64_t)(element_type *)&stack0xffffffffffffffc8;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar17 << 0x40));
    if (bVar41) {
      return (Expression *)(Binary *)local_38.id;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    local_540 = 0;
    uStack_538 = 0x10;
    auVar18._4_4_ = uStack_534;
    auVar18._0_4_ = 0x10;
    auVar18._8_8_ = &local_100;
    auVar18._16_8_ = &local_88;
    auVar18._24_8_ = local_520;
    auVar18._32_8_ = 0;
    local_530 = &local_100;
    paStack_528 = &local_88;
    local_100._0_8_ = (element_type *)&stack0xffffffffffffffc8;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar18 << 0x40));
    if (bVar41) {
      wasm = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
      options = &((this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).super_Pass.runner)->options;
      pBVar50 = local_40;
      goto LAB_009e7557;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    local_100.i64 = 0;
    local_100._8_4_ = 9;
    local_f0._0_8_ = local_148;
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    x_1 = (Expression *)this;
    local_f0._8_8_ = &local_88;
    bVar41 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar41) {
      Literal::makeZero((Literal *)&local_88.func,type);
      pBVar50 = local_40;
      Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
LAB_009e6d5e:
      Literal::~Literal((Literal *)&local_88.func);
      return (Expression *)pBVar50;
    }
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = CONCAT44(local_78.submatchers.curr.data._4_4_,0x80000000);
    local_88.i64 = 0;
    local_518 = 0;
    uStack_510 = 3;
    auVar19._4_4_ = uStack_50c;
    auVar19._0_4_ = 3;
    auVar19._8_8_ = &local_100;
    auVar19._16_8_ = &local_88;
    auVar19._24_8_ = local_4f8;
    auVar19._32_8_ = 0;
    local_508 = &local_100;
    paStack_500 = &local_88;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                         )(auVar19 << 0x40));
    if (bVar41) {
      curr->op = EqInt32;
      return (Expression *)curr;
    }
    if ((((this->
          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
          ).super_Pass.runner)->options).shrinkLevel == 0) {
      local_100.i64 = 0;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      local_78.submatchers.curr.data = -0x8000000000000000;
      local_88.i64 = 0;
      local_4f0 = 0;
      uStack_4e8 = 0x1c;
      auVar20._4_4_ = uStack_4e4;
      auVar20._0_4_ = 0x1c;
      auVar20._8_8_ = &local_100;
      auVar20._16_8_ = &local_88;
      auVar20._24_8_ = local_4d0;
      auVar20._32_8_ = 0;
      local_4e0 = &local_100;
      paStack_4d8 = &local_88;
      bVar41 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                           )(auVar20 << 0x40));
      if (bVar41) {
        curr->op = EqInt64;
        (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 2;
        UVar45 = ExtendUInt32;
        goto LAB_009e6c9c;
      }
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    local_100.i64 = 0;
    local_100._8_4_ = 0x17;
    local_f0._0_8_ = local_148;
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    x_1 = (Expression *)this;
    local_f0._8_8_ = &local_88;
    bVar41 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar41) {
      Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
      pBVar50 = local_40;
      Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
      Literal::~Literal((Literal *)&local_88.func);
      local_40 = pBVar50;
LAB_009e777e:
      (local_40->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 2;
      return (Expression *)local_40;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    local_4c8 = 0;
    uStack_4c0 = 0x19;
    auVar21._4_4_ = uStack_4bc;
    auVar21._0_4_ = 0x19;
    auVar21._8_8_ = &local_100;
    auVar21._16_8_ = &local_88;
    auVar21._24_8_ = local_4a8;
    auVar21._32_8_ = 0;
    local_4b8 = &local_100;
    paStack_4b0 = &local_88;
    local_100._0_8_ = (element_type *)&stack0xffffffffffffffc8;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar21 << 0x40));
    if (bVar41) {
      Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
LAB_009e78b9:
      Literal::~Literal((Literal *)&local_88.func);
      (local_40->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 2;
      wasm = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
      options = &((this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).super_Pass.runner)->options;
      pBVar50 = local_40;
LAB_009e7557:
      pBVar50 = (Binary *)
                wasm::getDroppedChildrenAndAppend
                          ((Expression *)curr,wasm,options,(Expression *)pBVar50,NoticeParentEffects
                          );
      return (Expression *)pBVar50;
    }
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    local_4a0 = 0;
    uStack_498 = 0x1b;
    paStack_488 = &local_88;
    auVar22._4_4_ = uStack_494;
    auVar22._0_4_ = 0x1b;
    auVar22._8_8_ = &local_100;
    auVar22._16_8_ = paStack_488;
    auVar22._24_8_ = local_480;
    auVar22._32_8_ = 0;
    local_490 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar22 << 0x40));
    if (bVar41) {
      Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
      goto LAB_009e78b9;
    }
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    local_100.i64 = 0;
    local_100._8_4_ = 0x1d;
    local_f0._0_8_ = local_148;
    local_f0._8_8_ = &local_88;
    x_1 = (Expression *)this;
    bVar41 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    if (bVar41) {
      Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
      Literal::~Literal((Literal *)&local_88.func);
      goto LAB_009e777e;
    }
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    local_478 = 0;
    uStack_470 = 0x17;
    paStack_460 = &local_88;
    auVar23._4_4_ = uStack_46c;
    auVar23._0_4_ = 0x17;
    auVar23._8_8_ = &local_100;
    auVar23._16_8_ = paStack_460;
    auVar23._24_8_ = local_458;
    auVar23._32_8_ = 0;
    local_468 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar23 << 0x40));
    if (bVar41) {
LAB_009e79ef:
      OVar52 = Ne;
LAB_009e7a79:
      BVar46 = Abstract::getBinary(type,OVar52);
      curr->op = BVar46;
      return (Expression *)curr;
    }
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    local_450 = 0;
    uStack_448 = 0x19;
    paStack_438 = &local_88;
    auVar24._4_4_ = uStack_444;
    auVar24._0_4_ = 0x19;
    auVar24._8_8_ = &local_100;
    auVar24._16_8_ = paStack_438;
    auVar24._24_8_ = local_430;
    auVar24._32_8_ = 0;
    local_440 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar24 << 0x40));
    if (bVar41) {
LAB_009e7a6d:
      OVar52 = Eq;
      goto LAB_009e7a79;
    }
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_88.i64 = 0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0;
    local_428 = 0;
    uStack_420 = 0x1b;
    paStack_410 = &local_88;
    auVar25._4_4_ = uStack_41c;
    auVar25._0_4_ = 0x1b;
    auVar25._8_8_ = &local_100;
    auVar25._16_8_ = paStack_410;
    auVar25._24_8_ = local_408;
    auVar25._32_8_ = 0;
    local_418 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar25 << 0x40));
    if (bVar41) goto LAB_009e79ef;
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    local_400 = 0;
    uStack_3f8 = 0x1d;
    paStack_3e8 = &local_88;
    auVar26._4_4_ = uStack_3f4;
    auVar26._0_4_ = 0x1d;
    auVar26._8_8_ = &local_100;
    auVar26._16_8_ = paStack_3e8;
    auVar26._24_8_ = local_3e0;
    auVar26._32_8_ = 0;
    local_3f0 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar26 << 0x40));
    if (bVar41) goto LAB_009e7a6d;
    local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&inner;
    local_100.i64 = 0;
    local_100._8_4_ = 0x16;
    local_f0._0_8_ = local_148;
    local_f0._8_8_ = &local_88;
    x_1 = (Expression *)this;
    bVar41 = Match::Internal::
             Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
             ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                        *)&local_100.func,
                       (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                        )curr);
    pBVar50 = curr;
    if ((bVar41) && (bVar41 = Literal::isSignedMin((Literal *)&inner->op), bVar41)) {
      Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
      Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
LAB_009e7df0:
      Literal::~Literal((Literal *)&local_88.func);
      (local_40->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 2;
      bVar41 = false;
      pBVar50 = local_40;
    }
    else {
      local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&inner;
      local_100.i64 = 0;
      local_100._8_4_ = 0x18;
      local_f0._0_8_ = local_148;
      local_f0._8_8_ = &local_88;
      x_1 = (Expression *)this;
      bVar41 = Match::Internal::
               Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
               ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                          *)&local_100.func,
                         (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                          )curr);
      if ((bVar41) && (bVar41 = Literal::isSignedMax((Literal *)&inner->op), bVar41)) {
        Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
        Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
        goto LAB_009e7df0;
      }
      local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&inner;
      local_100.i64 = 0;
      local_100._8_4_ = 0x1a;
      local_f0._0_8_ = local_148;
      local_f0._8_8_ = &local_88;
      x_1 = (Expression *)this;
      bVar41 = Match::Internal::
               Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
               ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                          *)&local_100.func,
                         (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                          )curr);
      if ((bVar41) && (bVar41 = Literal::isSignedMax((Literal *)&inner->op), bVar41)) {
        Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
        Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
        goto LAB_009e7df0;
      }
      local_148 = (undefined1  [8])&stack0xffffffffffffffc8;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&inner;
      local_100.i64 = 0;
      local_100._8_4_ = 0x1c;
      local_f0._0_8_ = local_148;
      local_f0._8_8_ = &local_88;
      x_1 = (Expression *)this;
      bVar41 = Match::Internal::
               Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
               ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                          *)&local_100.func,
                         (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                          )curr);
      if ((bVar41) && (bVar41 = Literal::isSignedMin((Literal *)&inner->op), bVar41)) {
        Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
        Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
        goto LAB_009e7df0;
      }
      local_100.i64 = 0;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&inner;
      local_3d8 = 0;
      uStack_3d0 = 0x16;
      paStack_3c0 = &local_88;
      auVar27._4_4_ = uStack_3cc;
      auVar27._0_4_ = 0x16;
      auVar27._8_8_ = &local_100;
      auVar27._16_8_ = paStack_3c0;
      auVar27._24_8_ = local_3b8;
      auVar27._32_8_ = 0;
      local_3c8 = &local_100;
      bVar41 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                           )(auVar27 << 0x40));
      if ((bVar41) && (bVar41 = Literal::isSignedMax((Literal *)&inner->op), bVar41)) {
LAB_009e7fa7:
        OVar52 = Ne;
LAB_009e804f:
        BVar46 = Abstract::getBinary(type,OVar52);
        curr->op = BVar46;
        bVar41 = false;
      }
      else {
        local_100.i64 = 0;
        local_78.binder =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0
        ;
        local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&inner;
        local_3b0 = 0;
        uStack_3a8 = 0x18;
        paStack_398 = &local_88;
        auVar28._4_4_ = uStack_3a4;
        auVar28._0_4_ = 0x18;
        auVar28._8_8_ = &local_100;
        auVar28._16_8_ = paStack_398;
        auVar28._24_8_ = local_390;
        auVar28._32_8_ = 0;
        local_3a0 = &local_100;
        bVar41 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                           ((Expression *)curr,
                            (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                             )(auVar28 << 0x40));
        if ((bVar41) && (bVar41 = Literal::isSignedMin((Literal *)&inner->op), bVar41)) {
LAB_009e8043:
          OVar52 = Eq;
          goto LAB_009e804f;
        }
        local_100.i64 = 0;
        local_78.binder =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0
        ;
        local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&inner;
        local_388 = 0;
        uStack_380 = 0x1a;
        paStack_370 = &local_88;
        auVar29._4_4_ = uStack_37c;
        auVar29._0_4_ = 0x1a;
        auVar29._8_8_ = &local_100;
        auVar29._16_8_ = paStack_370;
        auVar29._24_8_ = local_368;
        auVar29._32_8_ = 0;
        local_378 = &local_100;
        bVar41 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                           ((Expression *)curr,
                            (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                             )(auVar29 << 0x40));
        if ((bVar41) && (bVar41 = Literal::isSignedMin((Literal *)&inner->op), bVar41))
        goto LAB_009e7fa7;
        local_100.i64 = 0;
        local_78.binder =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0
        ;
        local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&inner;
        local_360 = 0;
        uStack_358 = 0x1c;
        paStack_348 = &local_88;
        auVar30._4_4_ = uStack_354;
        auVar30._0_4_ = 0x1c;
        auVar30._8_8_ = &local_100;
        auVar30._16_8_ = paStack_348;
        auVar30._24_8_ = local_340;
        auVar30._32_8_ = 0;
        local_350 = &local_100;
        bVar41 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                           ((Expression *)curr,
                            (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                             )(auVar30 << 0x40));
        if (bVar41) {
          bVar43 = Literal::isSignedMax((Literal *)&inner->op);
          bVar41 = true;
          if (bVar43) goto LAB_009e8043;
        }
        else {
          bVar41 = true;
        }
      }
    }
    if (!bVar41) {
      return (Expression *)pBVar50;
    }
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xffffffffffffffc8;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -1;
    local_88.i64 = 0;
    local_338 = 0;
    uStack_330 = 5;
    paStack_320 = &local_88;
    auVar31._4_4_ = uStack_32c;
    auVar31._0_4_ = 5;
    auVar31._8_8_ = &local_100;
    auVar31._16_8_ = paStack_320;
    auVar31._24_8_ = local_318;
    auVar31._32_8_ = 0;
    local_328 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar31 << 0x40));
    if (bVar41) {
      Literal::makeZero((Literal *)&local_88.func,type);
      Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
      Literal::~Literal((Literal *)&local_88.func);
      BVar46 = Abstract::getBinary(type,Sub);
      curr->op = BVar46;
      curr->left = (Expression *)local_40;
      curr->right = (Expression *)local_38.id;
      return (Expression *)curr;
    }
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 1;
    local_88.i64 = 0;
    inner = (Binary *)&builder;
    local_148 = (undefined1  [8])0x0;
    x_1 = (Expression *)CONCAT44(x_1._4_4_,10);
    local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_88;
    local_138.func.super_IString.str._M_str = (char *)&inner;
    local_f0._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0
    ;
    local_e0 = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    paStack_d8 = (anon_union_16_6_1532cd5a_for_Literal_0 *)0xffffffffffffffff;
    local_100.i64 = 0;
    local_310 = 0;
    uStack_308 = 0x11;
    local_300 = local_148;
    auVar32._4_4_ = uStack_304;
    auVar32._0_4_ = 0x11;
    auVar32._8_8_ = local_300;
    auVar32._16_8_ = &local_100;
    auVar32._24_8_ = local_2f0;
    auVar32._32_8_ = 0;
    paStack_2f8 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                         )(auVar32 << 0x40));
    if (bVar41) {
      bVar41 = true;
      if ((((this->
            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
            ).super_Pass.runner)->options).targetJS == false) {
        BVar46 = Abstract::getBinary(type,RotL);
        curr->op = BVar46;
        Literal::makeFromInt32((Literal *)&local_88.func,-2,type);
        Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
        Literal::~Literal((Literal *)&local_88.func);
        curr->left = (Expression *)local_40;
        curr->right = (Expression *)builder.wasm;
        bVar41 = false;
        pBVar50 = curr;
      }
    }
    else {
      bVar41 = true;
    }
    if (!bVar41) {
      return (Expression *)pBVar50;
    }
    local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_148;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = 0x4000000000000000;
    local_88.i64 = 0;
    local_2e8 = 0;
    uStack_2e0 = 5;
    paStack_2d0 = &local_88;
    auVar33._4_4_ = uStack_2dc;
    auVar33._0_4_ = 5;
    auVar33._8_8_ = &local_100;
    auVar33._16_8_ = paStack_2d0;
    auVar33._24_8_ = local_2c8;
    auVar33._32_8_ = 0;
    local_2d8 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
                         )(auVar33 << 0x40));
    if (bVar41) {
      cVar3 = (char)((HeapType *)local_148)->id;
      if ((cVar3 == '\b') || (bVar41 = true, cVar3 == '\n')) {
        BVar46 = Abstract::getBinary(type,Add);
        curr->op = BVar46;
        iVar48 = ExpressionManipulator::copy
                           ((EVP_PKEY_CTX *)local_148,
                            (EVP_PKEY_CTX *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .currModule);
        curr->right = (Expression *)CONCAT44(extraout_var,iVar48);
        bVar41 = false;
        pBVar50 = curr;
      }
    }
    else {
      bVar41 = true;
    }
    if (!bVar41) {
      return (Expression *)pBVar50;
    }
    if (this->fastMath == true) {
      local_100.i64 = 0;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::ExactKind<long>_> *)local_148;
      local_88.i64 = 0;
      local_2c0 = 0;
      uStack_2b8 = 3;
      paStack_2a8 = &local_88;
      auVar34._4_4_ = uStack_2b4;
      auVar34._0_4_ = 3;
      auVar34._8_8_ = &local_100;
      auVar34._16_8_ = paStack_2a8;
      auVar34._24_8_ = local_2a0;
      auVar34._32_8_ = 0;
      local_2b0 = &local_100;
      bVar41 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                           )(auVar34 << 0x40));
      if (((!bVar41) || ((double)local_148 != 0.0)) || (NAN((double)local_148))) goto LAB_009e83fc;
      bVar41 = true;
      if ((long)local_148 < 0) {
        pBVar50 = (Binary *)curr->left;
        bVar41 = false;
      }
    }
    else {
LAB_009e83fc:
      bVar41 = true;
    }
    if (!bVar41) {
      return (Expression *)pBVar50;
    }
    builder.wasm = (Module *)&stack0xffffffffffffffc8;
    local_148 = (undefined1  [8])0x0;
    x_1 = (Expression *)CONCAT44(x_1._4_4_,1);
    local_138.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&builder;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_88.i64 = 0;
    local_298 = 0;
    uStack_290 = 5;
    local_288 = local_148;
    paStack_280 = &local_88;
    auVar35._4_4_ = uStack_28c;
    auVar35._0_4_ = 5;
    auVar35._8_8_ = local_288;
    auVar35._16_8_ = paStack_280;
    auVar35._24_8_ = local_278;
    auVar35._32_8_ = 0;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                         )(auVar35 << 0x40));
    if (bVar41) {
LAB_009e8539:
      this_01 = &local_40->op;
      Literal::neg((Literal *)&local_88.func,(Literal *)this_01);
      Literal::operator=((Literal *)this_01,(Literal *)&local_88.func);
LAB_009e6cc3:
      Literal::~Literal((Literal *)&local_88.func);
      curr->left = (Expression *)local_38.id;
      return (Expression *)curr;
    }
    local_158 = (undefined1  [8])&stack0xffffffffffffffc8;
    inner = (Binary *)0x0;
    c_1 = (Const *)CONCAT44(c_1._4_4_,1);
    local_190 = local_158;
    local_f0._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0
    ;
    local_e0 = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_100.i64 = 0;
    local_270 = 0;
    uStack_268 = 7;
    local_260 = &inner;
    auVar36._4_4_ = uStack_264;
    auVar36._0_4_ = 7;
    auVar36._8_8_ = local_260;
    auVar36._16_8_ = &local_100;
    auVar36._24_8_ = local_250;
    auVar36._32_8_ = 0;
    paStack_258 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                         )(auVar36 << 0x40));
    if (bVar41) goto LAB_009e8539;
    local_100.i64 = 0;
    local_78.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
    local_78.submatchers.curr.data = -0x4010000000000000;
    local_88.i64 = 0;
    local_248 = 0;
    uStack_240 = 5;
    paStack_230 = &local_88;
    auVar37._4_4_ = uStack_23c;
    auVar37._0_4_ = 5;
    auVar37._8_8_ = &local_100;
    auVar37._16_8_ = paStack_230;
    auVar37._24_8_ = local_228;
    auVar37._32_8_ = 0;
    local_238 = &local_100;
    bVar41 = Match::
             matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>>>>&>>
                       ((Expression *)curr,
                        (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
                         )(auVar37 << 0x40));
    if (!bVar41) {
      inner = (Binary *)&stack0xffffffffffffffc8;
      local_88.i64 = 0;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78._8_4_ = 1;
      local_220 = 0;
      uStack_218 = 5;
      local_210 = &inner;
      paStack_208 = &local_88;
      auVar38._4_4_ = uStack_214;
      auVar38._0_4_ = 5;
      auVar38._8_8_ = local_210;
      auVar38._16_8_ = paStack_208;
      auVar38._24_8_ = local_200;
      auVar38._32_8_ = 0;
      bVar41 = Match::
               matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>&>>
                         ((Expression *)curr,
                          (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                           )(auVar38 << 0x40));
      if (!bVar41) {
        builder.wasm = (Module *)&stack0xffffffffffffffc8;
        local_100.i64 = 0;
        local_f0._0_8_ =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_f0._8_4_ = 1;
        local_1f8 = 0;
        uStack_1f0 = 7;
        local_1e8 = &builder;
        auVar39._4_4_ = uStack_1ec;
        auVar39._0_4_ = 7;
        auVar39._8_8_ = local_1e8;
        auVar39._16_8_ = &local_100;
        auVar39._24_8_ = local_1d8;
        auVar39._32_8_ = 0;
        paStack_1e0 = &local_100;
        bVar41 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>&>>
                           ((Expression *)curr,
                            (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                             )(auVar39 << 0x40));
        if (!bVar41) {
          local_158 = (undefined1  [8])&stack0xffffffffffffffc8;
          local_148 = (undefined1  [8])0x0;
          local_138.i64 = 0;
          local_138._8_4_ = 1;
          local_1d0 = 0;
          uStack_1c8 = 6;
          local_1c0 = local_158;
          puStack_1b8 = local_148;
          auVar40._4_4_ = uStack_1c4;
          auVar40._0_4_ = 6;
          auVar40._8_8_ = local_1c0;
          auVar40._16_8_ = puStack_1b8;
          auVar40._24_8_ = local_1b0;
          auVar40._32_8_ = 0;
          bVar41 = Match::
                   matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>&>>
                             ((Expression *)curr,
                              (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
                               )(auVar40 << 0x40));
          if (!bVar41) goto LAB_009e87a8;
        }
      }
      if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id &
          0xfffffffffffffffe) == 2) {
        return (Expression *)(Binary *)local_38.id;
      }
      if (this->fastMath == true) {
        return (Expression *)(Binary *)local_38.id;
      }
LAB_009e87a8:
      local_148 = (undefined1  [8])local_158;
      local_78.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_78.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
      local_88.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&inner;
      local_100.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&builder;
      local_f0._0_8_ =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
      local_e0 = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)local_148;
      paStack_d8 = &local_88;
      x_1 = (Expression *)this;
      bVar41 = Match::Internal::
               Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
               ::matches((Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
                          *)&local_100.func,(candidate_t<wasm::Binary_*>)curr);
      if (((bVar41) && (dVar53 = Literal::getFloat((Literal *)&inner->op), NAN(dVar53))) &&
         (BVar46 = *(BinaryOp *)
                    &((builder.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
         BVar44 = Abstract::getBinary((Type)(((Literals *)((long)local_158 + 8))->
                                            super_SmallVector<wasm::Literal,_1UL>).usedFixed,
                                      CopySign), BVar46 != BVar44)) {
        bVar41 = Binary::isRelational((Binary *)builder.wasm);
        if (bVar41) {
          (inner->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 2;
          BVar46 = *(BinaryOp *)
                    &((builder.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          BVar44 = Abstract::getBinary((Type)(((Literals *)((long)local_158 + 8))->
                                             super_SmallVector<wasm::Literal,_1UL>).usedFixed,Ne);
          if (BVar46 == BVar44) {
            Literal::makeOne((Literal *)&local_88.func,(Type)0x2);
            Literal::operator=((Literal *)&inner->op,(Literal *)&local_88.func);
          }
          else {
            Literal::makeZero((Literal *)&local_88.func,(Type)0x2);
            Literal::operator=((Literal *)&inner->op,(Literal *)&local_88.func);
          }
        }
        else {
          Literal::standardizeNaN((Literal *)&local_88.func,(Literal *)&inner->op);
          Literal::operator=((Literal *)&inner->op,(Literal *)&local_88.func);
        }
        Literal::~Literal((Literal *)&local_88.func);
        return (Expression *)inner;
      }
      return (Expression *)0x0;
    }
    if (this->fastMath != true) {
      BVar46 = Abstract::getBinary(type,Sub);
      curr->op = BVar46;
      Literal::makeZero((Literal *)&local_100.func,type);
      Literal::neg((Literal *)&local_88.func,(Literal *)&local_100.func);
      Literal::operator=((Literal *)&local_40->op,(Literal *)&local_88.func);
      Literal::~Literal((Literal *)&local_88.func);
      Literal::~Literal((Literal *)&local_100.func);
      uVar1 = curr->left;
      uVar2 = curr->right;
      auVar54._8_4_ = (int)uVar1;
      auVar54._0_8_ = uVar2;
      auVar54._12_4_ = (int)((ulong)uVar1 >> 0x20);
      curr->left = (Expression *)uVar2;
      curr->right = (Expression *)auVar54._8_8_;
      return (Expression *)curr;
    }
    OVar52 = Neg;
  }
  UVar45 = Abstract::getUnary(type,OVar52);
  curr = (Binary *)local_38.id;
LAB_009e6c9c:
  pUVar51 = Builder::makeUnary(&local_b8,UVar45,(Expression *)curr);
  return (Expression *)pUVar51;
}

Assistant:

Expression* optimizeWithConstantOnRight(Binary* curr) {
    using namespace Match;
    using namespace Abstract;
    Builder builder(*getModule());
    Expression* left;
    auto* right = curr->right->cast<Const>();
    auto type = curr->right->type;

    // Operations on zero
    if (matches(curr, binary(Shl, any(&left), ival(0))) ||
        matches(curr, binary(ShrU, any(&left), ival(0))) ||
        matches(curr, binary(ShrS, any(&left), ival(0))) ||
        matches(curr, binary(Or, any(&left), ival(0))) ||
        matches(curr, binary(Xor, any(&left), ival(0)))) {
      return left;
    }
    if (matches(curr, binary(Mul, pure(&left), ival(0))) ||
        matches(curr, binary(And, pure(&left), ival(0)))) {
      return right;
    }
    // -x * C   ==>    x * -C,   if  shrinkLevel != 0  or  C != C_pot
    // -x * C   ==>   -(x * C),  otherwise
    //    where  x, C  are integers
    Binary* inner;
    if (matches(
          curr,
          binary(Mul, binary(&inner, Sub, ival(0), any(&left)), ival()))) {
      if (getPassOptions().shrinkLevel != 0 ||
          !Bits::isPowerOf2(right->value.getInteger())) {
        right->value = right->value.neg();
        curr->left = left;
        return curr;
      } else {
        curr->left = left;
        Const* zero = inner->left->cast<Const>();
        return builder.makeBinary(inner->op, zero, curr);
      }
    }
    // x == 0   ==>   eqz x
    if (matches(curr, binary(Eq, any(&left), ival(0)))) {
      return builder.makeUnary(Abstract::getUnary(type, EqZ), left);
    }
    // Operations on one
    // (signed)x % 1   ==>   0
    if (matches(curr, binary(RemS, pure(&left), ival(1)))) {
      right->value = Literal::makeZero(type);
      return right;
    }
    // (signed)x % C_pot != 0   ==>  (x & (abs(C_pot) - 1)) != 0
    {
      Const* c;
      Binary* inner;
      if (matches(curr,
                  binary(Ne, binary(&inner, RemS, any(), ival(&c)), ival(0))) &&
          (c->value.isSignedMin() ||
           Bits::isPowerOf2(c->value.abs().getInteger()))) {
        inner->op = Abstract::getBinary(c->type, And);
        if (c->value.isSignedMin()) {
          c->value = Literal::makeSignedMax(c->type);
        } else {
          c->value = c->value.abs().sub(Literal::makeOne(c->type));
        }
        return curr;
      }
    }
    // i32(bool(x)) == 1  ==>  i32(bool(x))
    // i32(bool(x)) != 0  ==>  i32(bool(x))
    // i32(bool(x)) & 1   ==>  i32(bool(x))
    // i64(bool(x)) & 1   ==>  i64(bool(x))
    if ((matches(curr, binary(EqInt32, any(&left), i32(1))) ||
         matches(curr, binary(NeInt32, any(&left), i32(0))) ||
         matches(curr, binary(And, any(&left), ival(1)))) &&
        Bits::getMaxBits(left, this) == 1) {
      return left;
    }
    // i64(bool(x)) == 1  ==>  i32(bool(x))
    // i64(bool(x)) != 0  ==>  i32(bool(x))
    if ((matches(curr, binary(EqInt64, any(&left), i64(1))) ||
         matches(curr, binary(NeInt64, any(&left), i64(0)))) &&
        Bits::getMaxBits(left, this) == 1) {
      return builder.makeUnary(WrapInt64, left);
    }
    // bool(x) != 1  ==>  !bool(x)
    if (matches(curr, binary(Ne, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      return builder.makeUnary(Abstract::getUnary(type, EqZ), left);
    }
    // bool(x)  ^ 1  ==>  !bool(x)
    if (matches(curr, binary(Xor, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      auto* result = builder.makeUnary(Abstract::getUnary(type, EqZ), left);
      if (left->type == Type::i64) {
        // Xor's result is also an i64 in this case, but EqZ returns i32, so we
        // must expand it so that we keep returning the same value as before.
        // This means we replace a xor and a const with a xor and an extend,
        // which is still smaller (the const is 2 bytes, the extend just 1), and
        // also the extend may be removed by further work.
        result = builder.makeUnary(ExtendUInt32, result);
      }
      return result;
    }
    // bool(x) | 1  ==>  1
    if (matches(curr, binary(Or, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      return getDroppedChildrenAndAppend(curr, right);
    }

    // Operations on all 1s
    // x & -1   ==>   x
    if (matches(curr, binary(And, any(&left), ival(-1)))) {
      return left;
    }
    // x | -1   ==>   -1
    if (matches(curr, binary(Or, any(&left), ival(-1)))) {
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (signed)x % -1   ==>   0
    if (matches(curr, binary(RemS, pure(&left), ival(-1)))) {
      right->value = Literal::makeZero(type);
      return right;
    }
    // i32(x) / i32.min_s   ==>   x == i32.min_s
    if (matches(
          curr,
          binary(DivSInt32, any(), i32(std::numeric_limits<int32_t>::min())))) {
      curr->op = EqInt32;
      return curr;
    }
    // i64(x) / i64.min_s   ==>   i64(x == i64.min_s)
    // only for zero shrink level
    if (getPassOptions().shrinkLevel == 0 &&
        matches(
          curr,
          binary(DivSInt64, any(), i64(std::numeric_limits<int64_t>::min())))) {
      curr->op = EqInt64;
      curr->type = Type::i32;
      return builder.makeUnary(ExtendUInt32, curr);
    }
    // (unsigned)x < 0   ==>   i32(0)
    if (matches(curr, binary(LtU, pure(&left), ival(0)))) {
      right->value = Literal::makeZero(Type::i32);
      right->type = Type::i32;
      return right;
    }
    // (unsigned)x <= -1  ==>   i32(1)
    if (matches(curr, binary(LeU, any(&left), ival(-1)))) {
      right->value = Literal::makeOne(Type::i32);
      right->type = Type::i32;
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (unsigned)x > -1   ==>   i32(0)
    if (matches(curr, binary(GtU, any(&left), ival(-1)))) {
      right->value = Literal::makeZero(Type::i32);
      right->type = Type::i32;
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (unsigned)x >= 0   ==>   i32(1)
    if (matches(curr, binary(GeU, pure(&left), ival(0)))) {
      right->value = Literal::makeOne(Type::i32);
      right->type = Type::i32;
      return right;
    }
    // (unsigned)x < -1   ==>   x != -1
    // Friendlier to JS emitting as we don't need to write an unsigned -1 value
    // which is large.
    if (matches(curr, binary(LtU, any(), ival(-1)))) {
      curr->op = Abstract::getBinary(type, Ne);
      return curr;
    }
    // (unsigned)x <= 0   ==>   x == 0
    if (matches(curr, binary(LeU, any(), ival(0)))) {
      curr->op = Abstract::getBinary(type, Eq);
      return curr;
    }
    // (unsigned)x > 0   ==>   x != 0
    if (matches(curr, binary(GtU, any(), ival(0)))) {
      curr->op = Abstract::getBinary(type, Ne);
      return curr;
    }
    // (unsigned)x >= -1  ==>   x == -1
    if (matches(curr, binary(GeU, any(), ival(-1)))) {
      curr->op = Abstract::getBinary(type, Eq);
      return curr;
    }
    {
      Const* c;
      // (signed)x < (i32|i64).min_s   ==>   i32(0)
      if (matches(curr, binary(LtS, pure(&left), ival(&c))) &&
          c->value.isSignedMin()) {
        right->value = Literal::makeZero(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x <= (i32|i64).max_s   ==>   i32(1)
      if (matches(curr, binary(LeS, pure(&left), ival(&c))) &&
          c->value.isSignedMax()) {
        right->value = Literal::makeOne(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x > (i32|i64).max_s   ==>   i32(0)
      if (matches(curr, binary(GtS, pure(&left), ival(&c))) &&
          c->value.isSignedMax()) {
        right->value = Literal::makeZero(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x >= (i32|i64).min_s   ==>   i32(1)
      if (matches(curr, binary(GeS, pure(&left), ival(&c))) &&
          c->value.isSignedMin()) {
        right->value = Literal::makeOne(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x < (i32|i64).max_s   ==>   x != (i32|i64).max_s
      if (matches(curr, binary(LtS, any(), ival(&c))) &&
          c->value.isSignedMax()) {
        curr->op = Abstract::getBinary(type, Ne);
        return curr;
      }
      // (signed)x <= (i32|i64).min_s   ==>   x == (i32|i64).min_s
      if (matches(curr, binary(LeS, any(), ival(&c))) &&
          c->value.isSignedMin()) {
        curr->op = Abstract::getBinary(type, Eq);
        return curr;
      }
      // (signed)x > (i32|i64).min_s   ==>   x != (i32|i64).min_s
      if (matches(curr, binary(GtS, any(), ival(&c))) &&
          c->value.isSignedMin()) {
        curr->op = Abstract::getBinary(type, Ne);
        return curr;
      }
      // (signed)x >= (i32|i64).max_s   ==>   x == (i32|i64).max_s
      if (matches(curr, binary(GeS, any(), ival(&c))) &&
          c->value.isSignedMax()) {
        curr->op = Abstract::getBinary(type, Eq);
        return curr;
      }
    }
    // x * -1   ==>   0 - x
    if (matches(curr, binary(Mul, any(&left), ival(-1)))) {
      right->value = Literal::makeZero(type);
      curr->op = Abstract::getBinary(type, Sub);
      curr->left = right;
      curr->right = left;
      return curr;
    }
    {
      // ~(1 << x) aka (1 << x) ^ -1  ==>  rotl(-2, x)
      Expression* x;
      // Note that we avoid this in JS mode, as emitting a rotation would
      // require lowering that rotation for JS in another cycle of work.
      if (matches(curr, binary(Xor, binary(Shl, ival(1), any(&x)), ival(-1))) &&
          !getPassOptions().targetJS) {
        curr->op = Abstract::getBinary(type, RotL);
        right->value = Literal::makeFromInt32(-2, type);
        curr->left = right;
        curr->right = x;
        return curr;
      }
    }
    {
      // x * 2.0  ==>  x + x
      // but we apply this only for simple expressions like
      // local.get and global.get for avoid using extra local
      // variable.
      Expression* x;
      if (matches(curr, binary(Mul, any(&x), fval(2.0))) &&
          (x->is<LocalGet>() || x->is<GlobalGet>())) {
        curr->op = Abstract::getBinary(type, Abstract::Add);
        curr->right = ExpressionManipulator::copy(x, *getModule());
        return curr;
      }
    }
    {
      // x + (-0.0)   ==>   x
      double value;
      if (fastMath && matches(curr, binary(Add, any(), fval(&value))) &&
          value == 0.0 && std::signbit(value)) {
        return curr->left;
      }
    }
    // -x * fval(C)   ==>   x * -C
    // -x / fval(C)   ==>   x / -C
    if (matches(curr, binary(Mul, unary(Neg, any(&left)), fval())) ||
        matches(curr, binary(DivS, unary(Neg, any(&left)), fval()))) {
      right->value = right->value.neg();
      curr->left = left;
      return curr;
    }
    // x * -1.0   ==>
    //       -x,  if fastMath == true
    // -0.0 - x,  if fastMath == false
    if (matches(curr, binary(Mul, any(), fval(-1.0)))) {
      if (fastMath) {
        return builder.makeUnary(Abstract::getUnary(type, Neg), left);
      }
      // x * -1.0   ==>  -0.0 - x
      curr->op = Abstract::getBinary(type, Sub);
      right->value = Literal::makeZero(type).neg();
      std::swap(curr->left, curr->right);
      return curr;
    }
    if (matches(curr, binary(Mul, any(&left), constant(1))) ||
        matches(curr, binary(DivS, any(&left), constant(1))) ||
        matches(curr, binary(DivU, any(&left), constant(1)))) {
      if (curr->type.isInteger() || fastMath) {
        return left;
      }
    }
    {
      //   x !=  NaN   ==>   1
      //   x <=> NaN   ==>   0
      //   x op  NaN'  ==>   NaN',  iff `op` != `copysign` and `x` != C
      Const* c;
      Binary* bin;
      Expression* x;
      if (matches(curr, binary(&bin, pure(&x), fval(&c))) &&
          std::isnan(c->value.getFloat()) &&
          bin->op != getBinary(x->type, CopySign)) {
        if (bin->isRelational()) {
          // reuse "c" (nan) constant
          c->type = Type::i32;
          if (bin->op == getBinary(x->type, Ne)) {
            // x != NaN  ==>  1
            c->value = Literal::makeOne(Type::i32);
          } else {
            // x == NaN,
            // x >  NaN,
            // x <= NaN
            // x .. NaN  ==>  0
            c->value = Literal::makeZero(Type::i32);
          }
          return c;
        }
        // propagate NaN of RHS but canonicalize it
        c->value = Literal::standardizeNaN(c->value);
        return c;
      }
    }
    return nullptr;
  }